

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_lib.c
# Opt level: O0

int EVP_CIPHER_CTX_get_iv_length(EVP_CIPHER_CTX *ctx)

{
  int iVar1;
  unsigned_long uVar2;
  EVP_CIPHER_CTX *in_RDI;
  OSSL_PARAM params [2];
  size_t v;
  int len;
  int rv;
  OSSL_PARAM *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  EVP_CIPHER *obj;
  undefined1 local_a0 [40];
  void *local_20;
  int local_18;
  int local_14;
  EVP_CIPHER_CTX *local_10;
  int local_4;
  
  local_10 = in_RDI;
  local_18 = EVP_CIPHER_get_iv_length((EVP_CIPHER *)in_RDI->cipher);
  local_20 = (void *)(long)local_18;
  memset(&stack0xffffffffffffff88,0,0x50);
  obj = (EVP_CIPHER *)&stack0xffffffffffffff88;
  OSSL_PARAM_construct_size_t
            ((char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (size_t *)in_stack_ffffffffffffff48);
  memcpy(obj,local_a0,0x28);
  local_14 = evp_do_ciph_ctx_getparams
                       (obj,(void *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff48);
  if (local_14 == -1) {
    uVar2 = EVP_CIPHER_get_flags((EVP_CIPHER *)local_10->cipher);
    if ((uVar2 & 0x800) == 0) {
      local_4 = local_18;
    }
    else {
      iVar1 = EVP_CIPHER_CTX_ctrl(local_10,0x25,0,&stack0xffffffffffffffe8);
      local_4 = local_18;
      if (iVar1 != 1) {
        local_4 = -1;
      }
    }
  }
  else if (local_14 == 0) {
    local_4 = -1;
  }
  else {
    local_4 = (int)local_20;
  }
  return local_4;
}

Assistant:

int EVP_CIPHER_CTX_get_iv_length(const EVP_CIPHER_CTX *ctx)
{
    int rv, len = EVP_CIPHER_get_iv_length(ctx->cipher);
    size_t v = len;
    OSSL_PARAM params[2] = { OSSL_PARAM_END, OSSL_PARAM_END };

    params[0] = OSSL_PARAM_construct_size_t(OSSL_CIPHER_PARAM_IVLEN, &v);
    rv = evp_do_ciph_ctx_getparams(ctx->cipher, ctx->algctx, params);
    if (rv == EVP_CTRL_RET_UNSUPPORTED)
        goto legacy;
    return rv != 0 ? (int)v : -1;
    /* Code below to be removed when legacy support is dropped. */
legacy:
    if ((EVP_CIPHER_get_flags(ctx->cipher) & EVP_CIPH_CUSTOM_IV_LENGTH) != 0) {
        rv = EVP_CIPHER_CTX_ctrl((EVP_CIPHER_CTX *)ctx, EVP_CTRL_GET_IVLEN,
                                 0, &len);
        return (rv == 1) ? len : -1;
    }
    return len;
}